

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O1

basic_value<toml::type_config> * __thiscall
toml::basic_value<toml::type_config>::operator=
          (basic_value<toml::type_config> *this,basic_value<toml::type_config> *v)

{
  anon_union_64_11_c2653db1_for_basic_value<toml::type_config>_2 *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  value_type_conflict5 vVar9;
  size_type sVar10;
  undefined8 uVar11;
  uint16_t uVar12;
  uint8_t uVar13;
  long lVar14;
  long lVar15;
  string *psVar16;
  
  if (this == v) {
    return this;
  }
  cleanup(this,(EVP_PKEY_CTX *)v);
  this->type_ = v->type_;
  (this->region_).source_.
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (v->region_).source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->region_).source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(v->region_).source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&(this->region_).source_name_,&(v->region_).source_name_);
  (this->region_).last_column_ = (v->region_).last_column_;
  sVar4 = (v->region_).length_;
  sVar5 = (v->region_).first_;
  sVar6 = (v->region_).first_line_;
  sVar7 = (v->region_).first_column_;
  sVar8 = (v->region_).last_line_;
  (this->region_).last_ = (v->region_).last_;
  (this->region_).last_line_ = sVar8;
  (this->region_).first_line_ = sVar6;
  (this->region_).first_column_ = sVar7;
  (this->region_).length_ = sVar4;
  (this->region_).first_ = sVar5;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->comments_,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&v->comments_);
  this_00 = &this->field_1;
  switch(this->type_) {
  case boolean:
    (this_00->offset_datetime_).value.date.year = (int16_t)(v->field_1).boolean_;
    break;
  case integer:
    (this->field_1).integer_.value = (v->field_1).integer_.value;
    uVar12 = *(uint16_t *)((long)&v->field_1 + 10);
    uVar1 = *(undefined4 *)&(v->field_1).offset_datetime_.value.time.nanosecond;
    uVar2 = *(undefined4 *)((long)&v->field_1 + 0x10);
    uVar3 = *(undefined4 *)((long)&v->field_1 + 0x14);
    *(uint16_t *)((long)&this->field_1 + 8) = *(uint16_t *)((long)&v->field_1 + 8);
    *(uint16_t *)((long)&this->field_1 + 10) = uVar12;
    *(undefined4 *)&(this->field_1).offset_datetime_.value.time.nanosecond = uVar1;
    *(undefined4 *)((long)&this->field_1 + 0x10) = uVar2;
    *(undefined4 *)((long)&this->field_1 + 0x14) = uVar3;
    *(undefined8 *)((long)&(this->field_1).string_.value.field_2 + 8) =
         *(undefined8 *)((long)&(v->field_1).string_.value.field_2 + 8);
    psVar16 = (string *)((long)&this->field_1 + 0x20);
    *(undefined1 **)((long)&this->field_1 + 0x20) = (undefined1 *)((long)&this->field_1 + 0x30);
    lVar15 = *(long *)((long)&v->field_1 + 0x20);
    lVar14 = *(long *)((long)&v->field_1 + 0x28);
    goto LAB_00391b54;
  case floating:
    (this->field_1).integer_.value = (v->field_1).integer_.value;
    uVar12 = *(uint16_t *)((long)&v->field_1 + 10);
    uVar1 = *(undefined4 *)&(v->field_1).offset_datetime_.value.time.nanosecond;
    uVar2 = *(undefined4 *)((long)&v->field_1 + 0x10);
    uVar3 = *(undefined4 *)((long)&v->field_1 + 0x14);
    *(uint16_t *)((long)&this->field_1 + 8) = *(uint16_t *)((long)&v->field_1 + 8);
    *(uint16_t *)((long)&this->field_1 + 10) = uVar12;
    *(undefined4 *)&(this->field_1).offset_datetime_.value.time.nanosecond = uVar1;
    *(undefined4 *)((long)&this->field_1 + 0x10) = uVar2;
    *(undefined4 *)((long)&this->field_1 + 0x14) = uVar3;
    psVar16 = (string *)((long)&this->field_1 + 0x18);
    *(undefined1 **)((long)&(this->field_1).string_.value.field_2 + 8) =
         (undefined1 *)((long)&this->field_1 + 0x28);
    lVar15 = *(long *)((long)&(v->field_1).string_.value.field_2 + 8);
    lVar14 = *(long *)((long)&v->field_1 + 0x20);
LAB_00391b54:
    std::__cxx11::string::_M_construct<char*>(psVar16,lVar15,lVar14 + lVar15);
    break;
  case string:
    (this->field_1).integer_.value = (value_type_conflict5)((long)&this->field_1 + 0x10);
    lVar15 = (v->field_1).integer_.value;
    std::__cxx11::string::_M_construct<char*>
              ((string *)this_00,lVar15,(v->field_1).string_.value._M_string_length + lVar15);
    (this->field_1).string_.format = (v->field_1).string_.format;
    break;
  case offset_datetime:
  case local_datetime:
  case local_time:
    vVar9 = (v->field_1).integer_.value;
    sVar10 = (v->field_1).string_.value._M_string_length;
    uVar11 = *(undefined8 *)((long)&(v->field_1).string_.value.field_2 + 8);
    (this->field_1).string_.value.field_2._M_allocated_capacity =
         (v->field_1).string_.value.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(this->field_1).string_.value.field_2 + 8) = uVar11;
    (this_00->integer_).value = vVar9;
    (this->field_1).string_.value._M_string_length = sVar10;
    break;
  case local_date:
    uVar13 = *(uint8_t *)((long)&v->field_1 + 5);
    *(uint8_t *)((long)&this->field_1 + 4) = *(uint8_t *)((long)&v->field_1 + 4);
    *(uint8_t *)((long)&this->field_1 + 5) = uVar13;
    (this_00->offset_datetime_).value.date = (v->field_1).offset_datetime_.value.date;
    break;
  case array:
    detail::
    value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>,_toml::array_format_info>
    ::value_with_format((value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>,_toml::array_format_info>
                         *)&this_00->boolean_,
                        (value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>,_toml::array_format_info>
                         *)&(v->field_1).boolean_);
    break;
  case table:
    detail::
    value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>_>,_toml::table_format_info>
    ::value_with_format((value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>_>,_toml::table_format_info>
                         *)&this_00->boolean_,
                        (value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>_>,_toml::table_format_info>
                         *)&(v->field_1).boolean_);
    break;
  default:
    (this_00->boolean_).value = false;
  }
  return this;
}

Assistant:

basic_value& operator=(const basic_value& v)
    {
        if(this == std::addressof(v)) {return *this;}

        this->cleanup();
        this->type_     = v.type_;
        this->region_   = v.region_;
        this->comments_ = v.comments_;
        switch(this->type_)
        {
            case value_t::boolean        : assigner(boolean_        , v.boolean_        ); break;
            case value_t::integer        : assigner(integer_        , v.integer_        ); break;
            case value_t::floating       : assigner(floating_       , v.floating_       ); break;
            case value_t::string         : assigner(string_         , v.string_         ); break;
            case value_t::offset_datetime: assigner(offset_datetime_, v.offset_datetime_); break;
            case value_t::local_datetime : assigner(local_datetime_ , v.local_datetime_ ); break;
            case value_t::local_date     : assigner(local_date_     , v.local_date_     ); break;
            case value_t::local_time     : assigner(local_time_     , v.local_time_     ); break;
            case value_t::array          : assigner(array_          , v.array_          ); break;
            case value_t::table          : assigner(table_          , v.table_          ); break;
            default                      : assigner(empty_          , '\0'              ); break;
        }
        return *this;
    }